

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device_post_init(ma_device *pDevice,ma_device_type deviceType,
                             ma_device_descriptor *pDescriptorPlayback,
                             ma_device_descriptor *pDescriptorCapture)

{
  ma_channel *pmVar1;
  ma_data_converter *pConverter;
  void **ppvVar2;
  uint uVar3;
  ma_uint32 mVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var8;
  ma_bool32 mVar11;
  uint uVar12;
  ma_result mVar13;
  ma_uint64 mVar14;
  ulong uVar15;
  void *pvVar16;
  char *pcVar17;
  ma_context *pmVar18;
  ma_device_type mVar19;
  ma_device_info deviceInfo;
  
  if (pDevice == (ma_device *)0x0) {
    return MA_INVALID_ARGS;
  }
  uVar3 = deviceType - ma_device_type_capture;
  if (uVar3 < 3) {
    mVar11 = ma_device_descriptor_is_valid(pDescriptorCapture);
    if (mVar11 == 0) {
      return MA_INVALID_ARGS;
    }
    (pDevice->capture).internalFormat = pDescriptorCapture->format;
    (pDevice->capture).internalChannels = pDescriptorCapture->channels;
    (pDevice->capture).internalSampleRate = pDescriptorCapture->sampleRate;
    memcpy((pDevice->capture).internalChannelMap,pDescriptorCapture->channelMap,0xfe);
    mVar4 = pDescriptorCapture->periodSizeInFrames;
    (pDevice->capture).internalPeriodSizeInFrames = mVar4;
    (pDevice->capture).internalPeriods = pDescriptorCapture->periodCount;
    if (mVar4 == 0) {
      if (pDescriptorCapture->sampleRate == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (pDescriptorCapture->sampleRate * pDescriptorCapture->periodSizeInMilliseconds) /
                 1000;
      }
      (pDevice->capture).internalPeriodSizeInFrames = uVar12;
    }
  }
  mVar19 = deviceType & ~ma_device_type_capture;
  if (mVar19 == ma_device_type_playback) {
    mVar11 = ma_device_descriptor_is_valid(pDescriptorPlayback);
    if (mVar11 == 0) {
      return MA_INVALID_ARGS;
    }
    (pDevice->playback).internalFormat = pDescriptorPlayback->format;
    (pDevice->playback).internalChannels = pDescriptorPlayback->channels;
    (pDevice->playback).internalSampleRate = pDescriptorPlayback->sampleRate;
    memcpy((pDevice->playback).internalChannelMap,pDescriptorPlayback->channelMap,0xfe);
    mVar4 = pDescriptorPlayback->periodSizeInFrames;
    (pDevice->playback).internalPeriodSizeInFrames = mVar4;
    (pDevice->playback).internalPeriods = pDescriptorPlayback->periodCount;
    if (mVar4 == 0) {
      if (pDescriptorPlayback->sampleRate == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (pDescriptorPlayback->sampleRate * pDescriptorPlayback->periodSizeInMilliseconds) /
                 1000;
      }
      (pDevice->playback).internalPeriodSizeInFrames = uVar12;
    }
  }
  if (uVar3 < 3) {
    mVar13 = ma_device_get_info(pDevice,(deviceType != ma_device_type_loopback) +
                                        ma_device_type_playback,&deviceInfo);
    if (mVar13 == MA_SUCCESS) {
      pcVar17 = deviceInfo.name;
    }
    else if (pDescriptorCapture->pDeviceID == (ma_device_id *)0x0) {
      pcVar17 = "Default Capture Device";
    }
    else {
      pcVar17 = "Capture Device";
    }
    ma_strncpy_s((pDevice->capture).name,0x100,pcVar17,0xffffffffffffffff);
  }
  if (mVar19 == ma_device_type_playback) {
    mVar13 = ma_device_get_info(pDevice,ma_device_type_playback,&deviceInfo);
    if (mVar13 == MA_SUCCESS) {
      pcVar17 = deviceInfo.name;
    }
    else if (pDescriptorPlayback->pDeviceID == (ma_device_id *)0x0) {
      pcVar17 = "Default Playback Device";
    }
    else {
      pcVar17 = "Playback Device";
    }
    ma_strncpy_s((pDevice->playback).name,0x100,pcVar17,0xffffffffffffffff);
  }
  if (uVar3 < 3) {
    if ((pDevice->capture).format == ma_format_unknown) {
      (pDevice->capture).format = (pDevice->capture).internalFormat;
    }
    uVar12 = (pDevice->capture).channels;
    if (uVar12 == 0) {
      uVar12 = (pDevice->capture).internalChannels;
      (pDevice->capture).channels = uVar12;
    }
    if ((pDevice->capture).channelMap[0] == '\0') {
      if (0xfe < uVar12) {
        __assert_fail("pDevice->capture.channels <= 254",
                      "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/miniaudio.h"
                      ,0x9e99,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
      }
      pmVar1 = (pDevice->capture).channelMap;
      if ((pDevice->capture).internalChannels == uVar12) {
        if (uVar12 != 0) {
          memcpy(pmVar1,(pDevice->capture).internalChannelMap,(ulong)uVar12);
        }
      }
      else if ((pDevice->capture).channelMixMode == ma_channel_mix_mode_simple) {
        if (uVar12 != 0) {
          memset(pmVar1,0,(ulong)uVar12);
        }
      }
      else {
        ma_channel_map_init_standard(ma_standard_channel_map_default,pmVar1,0xfe,uVar12);
      }
    }
  }
  if (mVar19 == ma_device_type_playback) {
    if ((pDevice->playback).format == ma_format_unknown) {
      (pDevice->playback).format = (pDevice->playback).internalFormat;
    }
    uVar12 = (pDevice->playback).channels;
    if (uVar12 == 0) {
      uVar12 = (pDevice->playback).internalChannels;
      (pDevice->playback).channels = uVar12;
    }
    if ((pDevice->playback).channelMap[0] == '\0') {
      if (0xfe < uVar12) {
        __assert_fail("pDevice->playback.channels <= 254",
                      "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/miniaudio.h"
                      ,0x9eae,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
      }
      pmVar1 = (pDevice->playback).channelMap;
      if ((pDevice->playback).internalChannels == uVar12) {
        if (uVar12 != 0) {
          memcpy(pmVar1,(pDevice->playback).internalChannelMap,(ulong)uVar12);
        }
      }
      else if ((pDevice->playback).channelMixMode == ma_channel_mix_mode_simple) {
        if (uVar12 != 0) {
          memset(pmVar1,0,(ulong)uVar12);
        }
      }
      else {
        ma_channel_map_init_standard(ma_standard_channel_map_default,pmVar1,0xfe,uVar12);
      }
    }
  }
  deviceInfo.id._20_4_ = pDevice->sampleRate;
  if (deviceInfo.id._20_4_ == 0) {
    if (2 < uVar3) {
      deviceInfo.id._20_4_ = (pDevice->playback).internalSampleRate;
      pDevice->sampleRate = deviceInfo.id._20_4_;
      goto LAB_0010ccfe;
    }
    deviceInfo.id._20_4_ = (pDevice->capture).internalSampleRate;
    pDevice->sampleRate = deviceInfo.id._20_4_;
    deviceInfo.id._16_4_ = deviceInfo.id._20_4_;
LAB_0010cb9f:
    deviceInfo.id._72_8_ = 0;
    deviceInfo.id._80_8_ = 0;
    deviceInfo.id._56_8_ = 0;
    deviceInfo.id._64_8_ = 0;
    deviceInfo.id._40_4_ = 0;
    deviceInfo.id._52_4_ = 0;
    deviceInfo.id.winmm = (pDevice->capture).internalFormat;
    deviceInfo.id._8_4_ = (pDevice->capture).internalChannels;
    deviceInfo.id._24_8_ = (pDevice->capture).internalChannelMap;
    deviceInfo.id._4_4_ = (pDevice->capture).format;
    deviceInfo.id._12_4_ = (pDevice->capture).channels;
    deviceInfo.id._32_8_ = (pDevice->capture).channelMap;
    uVar6 = (pDevice->capture).channelMixMode;
    uVar9 = (pDevice->capture).calculateLFEFromSpatialChannels;
    deviceInfo.id._92_4_ = 0;
    deviceInfo.id._88_4_ = (pDevice->resampling).algorithm;
    deviceInfo.id._116_4_ = 0;
    deviceInfo.id._112_4_ = (pDevice->resampling).linear.lpfOrder;
    deviceInfo.id._96_8_ = (pDevice->resampling).pBackendVTable;
    deviceInfo.id._104_8_ = (pDevice->resampling).pBackendUserData;
    deviceInfo.id._44_4_ = uVar6;
    deviceInfo.id._48_4_ = uVar9;
    if ((pDevice->state).value != ma_device_state_uninitialized) {
      ma_data_converter_uninit
                (&(pDevice->capture).converter,&pDevice->pContext->allocationCallbacks);
    }
    mVar13 = ma_data_converter_init
                       ((ma_data_converter_config *)&deviceInfo,
                        &pDevice->pContext->allocationCallbacks,&(pDevice->capture).converter);
    if (mVar19 != ma_device_type_playback || mVar13 != MA_SUCCESS) {
      return mVar13;
    }
    deviceInfo.id._20_4_ = pDevice->sampleRate;
  }
  else {
    if (uVar3 < 3) {
      deviceInfo.id._16_4_ = (pDevice->capture).internalSampleRate;
      goto LAB_0010cb9f;
    }
LAB_0010ccfe:
    if (mVar19 != ma_device_type_playback) {
      return MA_SUCCESS;
    }
  }
  deviceInfo.id._72_8_ = 0;
  deviceInfo.id._80_8_ = 0;
  deviceInfo.id._56_8_ = 0;
  deviceInfo.id._64_8_ = 0;
  deviceInfo.id._40_4_ = 0;
  deviceInfo.id._52_4_ = 0;
  deviceInfo.id.winmm = (pDevice->playback).format;
  deviceInfo.id._8_4_ = (pDevice->playback).channels;
  deviceInfo.id._24_8_ = (pDevice->playback).channelMap;
  deviceInfo.id._4_4_ = (pDevice->playback).internalFormat;
  deviceInfo.id._12_4_ = (pDevice->playback).internalChannels;
  uVar5 = (pDevice->playback).internalSampleRate;
  deviceInfo.id._32_8_ = (pDevice->playback).internalChannelMap;
  uVar7 = (pDevice->playback).channelMixMode;
  uVar10 = (pDevice->playback).calculateLFEFromSpatialChannels;
  deviceInfo.id._92_4_ = 0;
  deviceInfo.id._88_4_ = (pDevice->resampling).algorithm;
  deviceInfo.id._116_4_ = 0;
  deviceInfo.id._112_4_ = (pDevice->resampling).linear.lpfOrder;
  deviceInfo.id._96_8_ = (pDevice->resampling).pBackendVTable;
  deviceInfo.id._104_8_ = (pDevice->resampling).pBackendUserData;
  deviceInfo.id._16_4_ = deviceInfo.id._20_4_;
  deviceInfo.id._44_4_ = uVar7;
  deviceInfo.id._48_4_ = uVar10;
  if ((pDevice->state).value != ma_device_state_uninitialized) {
    deviceInfo.id._20_4_ = uVar5;
    ma_data_converter_uninit(&(pDevice->playback).converter,&pDevice->pContext->allocationCallbacks)
    ;
    uVar5 = deviceInfo.id._20_4_;
  }
  deviceInfo.id._20_4_ = uVar5;
  pConverter = &(pDevice->playback).converter;
  mVar13 = ma_data_converter_init
                     ((ma_data_converter_config *)&deviceInfo,
                      &pDevice->pContext->allocationCallbacks,pConverter);
  if (mVar13 != MA_SUCCESS) {
    return mVar13;
  }
  (pDevice->playback).inputCacheConsumed = 0;
  (pDevice->playback).inputCacheRemaining = 0;
  if ((pDevice->type == ma_device_type_duplex) ||
     (mVar13 = ma_data_converter_get_required_input_frame_count
                         (pConverter,1,(ma_uint64 *)&deviceInfo), mVar13 != MA_SUCCESS)) {
    mVar14 = ma_calculate_frame_count_after_resampling
                       ((pDevice->playback).internalSampleRate,pDevice->sampleRate,
                        (ulong)(pDevice->playback).internalPeriodSizeInFrames);
    uVar15 = (*(int *)(&DAT_001b1b40 + (ulong)(pDevice->playback).format * 4) *
             (pDevice->playback).channels) * mVar14;
    ppvVar2 = &(pDevice->playback).pInputCache;
    pmVar18 = pDevice->pContext;
    if ((uVar15 >> 0x20 == 0) &&
       (p_Var8 = (pmVar18->allocationCallbacks).onRealloc,
       p_Var8 != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0)) {
      pvVar16 = (*p_Var8)(*ppvVar2,uVar15,(pmVar18->allocationCallbacks).pUserData);
      if (pvVar16 != (void *)0x0) {
        (pDevice->playback).pInputCache = pvVar16;
        (pDevice->playback).inputCacheCap = mVar14;
        goto LAB_0010cf2b;
      }
      pmVar18 = pDevice->pContext;
    }
    ma_free(*ppvVar2,&pmVar18->allocationCallbacks);
    *ppvVar2 = (void *)0x0;
    (pDevice->playback).inputCacheCap = 0;
    mVar13 = MA_OUT_OF_MEMORY;
  }
  else {
    ma_free((pDevice->playback).pInputCache,&pDevice->pContext->allocationCallbacks);
    (pDevice->playback).pInputCache = (void *)0x0;
    (pDevice->playback).inputCacheCap = 0;
LAB_0010cf2b:
    mVar13 = MA_SUCCESS;
  }
  return mVar13;
}

Assistant:

MA_API ma_result ma_device_post_init(ma_device* pDevice, ma_device_type deviceType, const ma_device_descriptor* pDescriptorPlayback, const ma_device_descriptor* pDescriptorCapture)
{
    ma_result result;

    if (pDevice == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Capture. */
    if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
        if (ma_device_descriptor_is_valid(pDescriptorCapture) == MA_FALSE) {
            return MA_INVALID_ARGS;
        }

        pDevice->capture.internalFormat             = pDescriptorCapture->format;
        pDevice->capture.internalChannels           = pDescriptorCapture->channels;
        pDevice->capture.internalSampleRate         = pDescriptorCapture->sampleRate;
        MA_COPY_MEMORY(pDevice->capture.internalChannelMap, pDescriptorCapture->channelMap, sizeof(pDescriptorCapture->channelMap));
        pDevice->capture.internalPeriodSizeInFrames = pDescriptorCapture->periodSizeInFrames;
        pDevice->capture.internalPeriods            = pDescriptorCapture->periodCount;

        if (pDevice->capture.internalPeriodSizeInFrames == 0) {
            pDevice->capture.internalPeriodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptorCapture->periodSizeInMilliseconds, pDescriptorCapture->sampleRate);
        }
    }

    /* Playback. */
    if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
        if (ma_device_descriptor_is_valid(pDescriptorPlayback) == MA_FALSE) {
            return MA_INVALID_ARGS;
        }

        pDevice->playback.internalFormat             = pDescriptorPlayback->format;
        pDevice->playback.internalChannels           = pDescriptorPlayback->channels;
        pDevice->playback.internalSampleRate         = pDescriptorPlayback->sampleRate;
        MA_COPY_MEMORY(pDevice->playback.internalChannelMap, pDescriptorPlayback->channelMap, sizeof(pDescriptorPlayback->channelMap));
        pDevice->playback.internalPeriodSizeInFrames = pDescriptorPlayback->periodSizeInFrames;
        pDevice->playback.internalPeriods            = pDescriptorPlayback->periodCount;

        if (pDevice->playback.internalPeriodSizeInFrames == 0) {
            pDevice->playback.internalPeriodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptorPlayback->periodSizeInMilliseconds, pDescriptorPlayback->sampleRate);
        }
    }

    /*
    The name of the device can be retrieved from device info. This may be temporary and replaced with a `ma_device_get_info(pDevice, deviceType)` instead.
    For loopback devices, we need to retrieve the name of the playback device.
    */
    {
        ma_device_info deviceInfo;

        if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
            result = ma_device_get_info(pDevice, (deviceType == ma_device_type_loopback) ? ma_device_type_playback : ma_device_type_capture, &deviceInfo);
            if (result == MA_SUCCESS) {
                ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), deviceInfo.name, (size_t)-1);
            } else {
                /* We failed to retrieve the device info. Fall back to a default name. */
                if (pDescriptorCapture->pDeviceID == NULL) {
                    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), MA_DEFAULT_CAPTURE_DEVICE_NAME, (size_t)-1);
                } else {
                    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), "Capture Device", (size_t)-1);
                }
            }
        }

        if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
            result = ma_device_get_info(pDevice, ma_device_type_playback, &deviceInfo);
            if (result == MA_SUCCESS) {
                ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), deviceInfo.name, (size_t)-1);
            } else {
                /* We failed to retrieve the device info. Fall back to a default name. */
                if (pDescriptorPlayback->pDeviceID == NULL) {
                    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), MA_DEFAULT_PLAYBACK_DEVICE_NAME, (size_t)-1);
                } else {
                    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), "Playback Device", (size_t)-1);
                }
            }
        }
    }

    /* Update data conversion. */
    return ma_device__post_init_setup(pDevice, deviceType); /* TODO: Should probably rename ma_device__post_init_setup() to something better. */
}